

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::
SetWhat<char_const*,char,int_const&,char,int_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],char_const*&>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char *args_2,
          int *args_3,char (*args_4) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
          char (*args_6) [3],char **args_7)

{
  ostringstream *in_RCX;
  Exception *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBX;
  ostream *in_RSI;
  char (*in_RDI) [3];
  char *in_R8;
  int *in_R9;
  char (*unaff_retaddr) [3];
  char **in_stack_00000008;
  int *in_stack_ffffffffffffffb8;
  char (*args_3_00) [3];
  
  args_3_00 = in_RDI;
  std::operator<<(in_RSI,*(char **)in_RDX);
  SetWhat<char,int_const&,char,int_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],char_const*&>
            (in_RDX,in_RCX,in_R8,in_R9,*in_RDI,in_stack_ffffffffffffffb8,args_3_00,unaff_RBX,
             unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }